

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall spirv_cross::Compiler::get_pointee_type_id(Compiler *this,uint32_t type_id)

{
  SPIRType *pSVar1;
  
  pSVar1 = get<spirv_cross::SPIRType>(this,type_id);
  if ((pSVar1->pointer == true) && (type_id = (pSVar1->parent_type).id, type_id == 0)) {
    __assert_fail("p_type->parent_type",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_cross.cpp"
                  ,0x514,"uint32_t spirv_cross::Compiler::get_pointee_type_id(uint32_t) const");
  }
  return type_id;
}

Assistant:

uint32_t Compiler::get_pointee_type_id(uint32_t type_id) const
{
	auto *p_type = &get<SPIRType>(type_id);
	if (p_type->pointer)
	{
		assert(p_type->parent_type);
		type_id = p_type->parent_type;
	}
	return type_id;
}